

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O2

void generateHeapOrder(int size,int heapNumber,vector<int,_std::allocator<int>_> *order)

{
  result_type rVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  mt19937 generator;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  mStack_13b8;
  
  std::vector<int,_std::allocator<int>_>::resize(order,(long)size);
  uVar2 = 0;
  rVar1 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mStack_13b8,rVar1);
  uVar3 = (ulong)heapNumber;
  uVar4 = (ulong)(uint)size;
  if (size < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&mStack_13b8);
    (order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar2] = (int)((rVar1 % uVar3 + uVar3) % uVar3);
  }
  return;
}

Assistant:

void generateHeapOrder(int size, int heapNumber, std::vector<int>& order) {
    order.resize(size);
    std::mt19937 generator(time(0));

    for (int i = 0; i < size; i++)
        order[i] = (generator() % heapNumber + heapNumber) % heapNumber;
}